

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_referenceType_withTupleAndTypeSlot
          (sysbvm_context_t *context,sysbvm_tuple_t referenceType,sysbvm_tuple_t tuple,
          sysbvm_tuple_t typeSlot)

{
  _Bool _Var1;
  sysbvm_object_tuple_t *psVar2;
  
  _Var1 = sysbvm_type_isReferenceType(referenceType);
  if (!_Var1) {
    sysbvm_error("Expected a reference type");
  }
  psVar2 = sysbvm_context_allocatePointerTuple(context,referenceType,2);
  (psVar2->field_1).pointers[0] = typeSlot;
  psVar2[1].header.field_0.typePointer = tuple;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_referenceType_withTupleAndTypeSlot(sysbvm_context_t *context, sysbvm_tuple_t referenceType, sysbvm_tuple_t tuple, sysbvm_tuple_t typeSlot)
{
    if(!sysbvm_type_isReferenceType(referenceType))
        sysbvm_error("Expected a reference type");

    sysbvm_object_tuple_t *reference = sysbvm_context_allocatePointerTuple(context, referenceType, 2);
    reference->pointers[0] = typeSlot;
    reference->pointers[1] = tuple;
    return (sysbvm_tuple_t)reference;
}